

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiStackLevelInfo *__dest;
  size_t sVar5;
  long lVar6;
  ImGuiStackLevelInfo *pIVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  pIVar4 = GImGui;
  uVar9 = (ulong)id;
  pIVar3 = GImGui->CurrentWindow;
  iVar1 = (GImGui->DebugIDStackTool).StackLevel;
  lVar12 = (long)iVar1;
  if (lVar12 == -1) {
    (GImGui->DebugIDStackTool).StackLevel = 0;
    iVar1 = (pIVar3->IDStack).Size;
    iVar2 = (pIVar4->DebugIDStackTool).Results.Capacity;
    iVar11 = (int)((long)iVar1 + 1);
    if (iVar2 <= iVar1) {
      if (iVar2 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar2 / 2 + iVar2;
      }
      if (iVar13 <= iVar11) {
        iVar13 = iVar11;
      }
      if (iVar2 < iVar13) {
        __dest = (ImGuiStackLevelInfo *)MemAlloc((long)iVar13 << 6);
        pIVar7 = (pIVar4->DebugIDStackTool).Results.Data;
        if (pIVar7 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest,pIVar7,(long)(pIVar4->DebugIDStackTool).Results.Size << 6);
          MemFree((pIVar4->DebugIDStackTool).Results.Data);
        }
        (pIVar4->DebugIDStackTool).Results.Data = __dest;
        (pIVar4->DebugIDStackTool).Results.Capacity = iVar13;
      }
    }
    iVar2 = (pIVar4->DebugIDStackTool).Results.Size;
    if (iVar2 <= iVar1) {
      lVar6 = ((long)iVar1 + 1) - (long)iVar2;
      lVar12 = (long)iVar2 << 6;
      do {
        pIVar7 = (pIVar4->DebugIDStackTool).Results.Data;
        pcVar8 = pIVar7->Desc + lVar12 + 0x29;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar7->Desc + lVar12 + 0x19;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar7->Desc + lVar12 + 9;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        pcVar8 = pIVar7->Desc + lVar12 + -7;
        pcVar8[0] = '\0';
        pcVar8[1] = '\0';
        pcVar8[2] = '\0';
        pcVar8[3] = '\0';
        pcVar8[4] = '\0';
        pcVar8[5] = '\0';
        pcVar8[6] = '\0';
        pcVar8[7] = '\0';
        pcVar8[8] = '\0';
        pcVar8[9] = '\0';
        pcVar8[10] = '\0';
        pcVar8[0xb] = '\0';
        pcVar8[0xc] = '\0';
        pcVar8[0xd] = '\0';
        pcVar8[0xe] = '\0';
        pcVar8[0xf] = '\0';
        lVar12 = lVar12 + 0x40;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    (pIVar4->DebugIDStackTool).Results.Size = iVar11;
    iVar1 = (pIVar3->IDStack).Size;
    if ((long)iVar1 < 0) {
      return;
    }
    pIVar7 = (pIVar4->DebugIDStackTool).Results.Data;
    uVar9 = 0;
    do {
      uVar10 = id;
      if (uVar9 < (ulong)(long)iVar1) {
        uVar10 = (pIVar3->IDStack).Data[uVar9];
      }
      pIVar7->ID = uVar10;
      uVar9 = uVar9 + 1;
      pIVar7 = pIVar7 + 1;
    } while (iVar1 + 1 != uVar9);
    return;
  }
  if (iVar1 != (pIVar3->IDStack).Size) {
    return;
  }
  pIVar7 = (GImGui->DebugIDStackTool).Results.Data;
  if (data_type < 0xd) {
    if (data_type != 4) {
      if (data_type == 0xc) {
        if (data_id_end == (void *)0x0) {
          sVar5 = strlen((char *)data_id);
        }
        else {
          sVar5 = (long)data_id_end - (long)data_id;
        }
        ImFormatString(pIVar7[lVar12].Desc,0x39,"%.*s",sVar5,data_id);
      }
      goto LAB_0018d1b1;
    }
    pcVar8 = "%d";
    uVar9 = (ulong)data_id & 0xffffffff;
  }
  else {
    if (data_type == 0xd) {
      ImFormatString(pIVar7[lVar12].Desc,0x39,"(void*)0x%p",data_id);
      goto LAB_0018d1b1;
    }
    if (data_type != 0xe) goto LAB_0018d1b1;
    if (pIVar7[lVar12].Desc[0] != '\0') {
      return;
    }
    pcVar8 = "0x%08X [override]";
  }
  ImFormatString(pIVar7[lVar12].Desc,0x39,pcVar8,uVar9);
LAB_0018d1b1:
  pIVar7[lVar12].QuerySuccess = true;
  pIVar7[lVar12].field_0x6 = (char)data_type;
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiIDStackTool* tool = &g.DebugIDStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}